

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

void __thiscall CMU462::PathTracer::set_scene(PathTracer *this,Scene *scene)

{
  BVHAccel *this_00;
  bool bVar1;
  EnvironmentLight *local_20;
  Scene *local_18;
  Scene *scene_local;
  PathTracer *this_local;
  
  if (this->state == INIT) {
    local_18 = scene;
    scene_local = (Scene *)this;
    if (this->scene != (Scene *)0x0) {
      if (scene != (Scene *)0x0) {
        StaticScene::Scene::~Scene(scene);
        operator_delete(scene,0x30);
      }
      this_00 = this->bvh;
      if (this_00 != (BVHAccel *)0x0) {
        StaticScene::BVHAccel::~BVHAccel(this_00);
        operator_delete(this_00,0x28);
      }
      std::
      stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
      ::pop(&this->selectionHistory);
    }
    if (this->envLight != (EnvironmentLight *)0x0) {
      local_20 = this->envLight;
      std::
      vector<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
      ::push_back(&local_18->lights,(value_type *)&local_20);
    }
    this->scene = local_18;
    build_accel(this);
    bVar1 = has_valid_configuration(this);
    if (bVar1) {
      this->state = READY;
    }
  }
  return;
}

Assistant:

void PathTracer::set_scene(Scene *scene) {

    if (state != INIT) {
      return;
    }

    if (this->scene != nullptr) {
      delete scene;
      delete bvh;
      selectionHistory.pop();
    }

    if (this->envLight != nullptr) {
      scene->lights.push_back(this->envLight);
    }

    this->scene = scene;
    build_accel();

    if (has_valid_configuration()) {
      state = READY;
    }
  }